

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint8_t cfd::core::SetPsbtOutput
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value,
                  wally_psbt_output *output)

{
  allocator<unsigned_char> *this;
  wally_psbt_output *pwVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  size_type sVar2;
  const_reference pvVar3;
  CfdException *pCVar4;
  uchar *puVar5;
  uchar *puVar6;
  wally_map *pwVar7;
  ulong __n;
  uint *puVar8;
  size_type sVar9;
  allocator local_369;
  string local_368;
  CfdSourceLocation local_348;
  allocator local_329;
  string local_328;
  undefined1 local_302;
  allocator local_301;
  string local_300;
  CfdSourceLocation local_2e0;
  allocator<unsigned_int> local_2c1;
  undefined1 local_2c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  size_t path_len;
  string local_298;
  CfdSourceLocation local_278;
  allocator local_259;
  string local_258;
  ByteData local_238;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  undefined1 local_1f0 [8];
  Pubkey pk;
  undefined1 local_1d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  string local_1b0;
  CfdSourceLocation local_190;
  undefined1 local_172;
  allocator local_171;
  string local_170;
  CfdSourceLocation local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130;
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  byte local_25;
  int local_24;
  bool has_key_1byte;
  wally_psbt_output *pwStack_20;
  int ret;
  wally_psbt_output *output_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  
  pwStack_20 = output;
  output_local = (wally_psbt_output *)value;
  value_local = key;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  local_25 = sVar2 == 1;
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
  pwVar1 = pwStack_20;
  if (*pvVar3 == '\0') {
    if ((local_25 & 1) == 0) {
      local_40.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_40.filename = local_40.filename + 1;
      local_40.line = 0x578;
      local_40.funcname = "SetPsbtOutput";
      logger::warn<>(&local_40,"psbt invalid key format.");
      local_75 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_60,"psbt invalid key format error.",&local_61)
      ;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_60);
      local_75 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (pwStack_20->redeem_script != (uchar *)0x0) {
      local_90.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_90.filename = local_90.filename + 1;
      local_90.line = 0x57d;
      local_90.funcname = "SetPsbtOutput";
      logger::warn<>(&local_90,"output redeemScript duplicates.");
      local_b2 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_b0,"psbt output redeemScript duplicates error.",&local_b1);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_b0);
      local_b2 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
    local_24 = wally_psbt_output_set_redeem_script(pwVar1,puVar5,sVar2);
    if (local_24 != 0) {
      local_d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_d0.filename = local_d0.filename + 1;
      local_d0.line = 0x585;
      local_d0.funcname = "SetPsbtOutput";
      logger::warn<int&>(&local_d0,"wally_psbt_output_set_redeem_script NG[{}]",&local_24);
      local_f2 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_f0,"psbt set output redeemScript error.",&local_f1);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_f0);
      local_f2 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_24 = 0;
  }
  else {
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
    pwVar1 = pwStack_20;
    if (*pvVar3 == '\x01') {
      if ((local_25 & 1) == 0) {
        local_110.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_110.filename = local_110.filename + 1;
        local_110.line = 0x58b;
        local_110.funcname = "SetPsbtOutput";
        logger::warn<>(&local_110,"psbt invalid key format.");
        local_132 = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_130,"psbt invalid key format error.",&local_131);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_130);
        local_132 = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (pwStack_20->witness_script != (uchar *)0x0) {
        local_150.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_150.filename = local_150.filename + 1;
        local_150.line = 0x590;
        local_150.funcname = "SetPsbtOutput";
        logger::warn<>(&local_150,"output witnessScript duplicates.");
        local_172 = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_170,"psbt output witnessScript duplicates error.",&local_171);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_170);
        local_172 = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
      local_24 = wally_psbt_output_set_witness_script(pwVar1,puVar5,sVar2);
      if (local_24 != 0) {
        local_190.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_190.filename = local_190.filename + 1;
        local_190.line = 0x598;
        local_190.funcname = "SetPsbtOutput";
        logger::warn<int&>(&local_190,"wally_psbt_output_set_witness_script NG[{}]",&local_24);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1b0,"psbt set output witnessScript error.",
                   (allocator *)
                   ((long)&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_1b0);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_24 = 0;
    }
    else {
      pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
      key_00 = value_local;
      if (*pvVar3 == '\x02') {
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
        this = (allocator<unsigned_char> *)
               ((long)&pk.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
        ::std::allocator<unsigned_char>::allocator(this);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0,sVar2 - 1,this
                  );
        ::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&pk.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
        if (sVar2 != 0) {
          puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
          puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
          sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
          memcpy(puVar5,puVar6 + 1,sVar2);
        }
        ByteData::ByteData((ByteData *)
                           &pk_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
        Pubkey::Pubkey((Pubkey *)local_1f0,
                       (ByteData *)
                       &pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData((ByteData *)
                            &pk_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        Pubkey::GetData(&local_238,(Pubkey *)local_1f0);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
                           &local_238);
        ByteData::~ByteData(&local_238);
        pwVar7 = &pwStack_20->keypaths;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_258,"output bip32 pubkey",&local_259);
        FindPsbtMap(pwVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
                    &local_258,(size_t *)0x0);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
        if (sVar2 < 4) {
          local_278.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_278.filename = local_278.filename + 1;
          local_278.line = 0x5a6;
          local_278.funcname = "SetPsbtOutput";
          logger::warn<>(&local_278,"psbt invalid value format.");
          path_len._6_1_ = 1;
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_298,"psbt invalid value format error.",
                     (allocator *)((long)&path_len + 7));
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_298);
          path_len._6_1_ = 0;
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
        path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(sVar2 - 4);
        __n = (ulong)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage >> 2;
        ::std::allocator<unsigned_int>::allocator(&local_2c1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0,__n,&local_2c1);
        ::std::allocator<unsigned_int>::~allocator(&local_2c1);
        if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          puVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0);
          puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local)
          ;
          memcpy(puVar8,puVar5 + 4,
                 (size_t)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pwVar7 = &pwStack_20->keypaths;
        puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
        puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
        puVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0);
        sVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0);
        local_24 = wally_map_add_keypath_item(pwVar7,puVar5,sVar2,puVar6,4,puVar8,sVar9);
        if (local_24 != 0) {
          local_2e0.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_2e0.filename = local_2e0.filename + 1;
          local_2e0.line = 0x5b4;
          local_2e0.funcname = "SetPsbtOutput";
          logger::warn<int&>(&local_2e0,"wally_map_add_keypath_item NG[{}]",&local_24);
          local_302 = 1;
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_300,"psbt set output pubkey error.",&local_301);
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_300);
          local_302 = 0;
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
        Pubkey::~Pubkey((Pubkey *)local_1f0);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
      }
      else {
        pwVar7 = &pwStack_20->unknowns;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_328,"output unknowns",&local_329);
        FindPsbtMap(pwVar7,key_00,&local_328,(size_t *)0x0);
        ::std::__cxx11::string::~string((string *)&local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
        pwVar7 = &pwStack_20->unknowns;
        puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
        puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
        sVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)output_local);
        local_24 = wally_map_add(pwVar7,puVar5,sVar2,puVar6,sVar9);
        if (local_24 != 0) {
          local_348.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_348.filename = local_348.filename + 1;
          local_348.line = 0x5bd;
          local_348.funcname = "SetPsbtOutput";
          logger::warn<int&>(&local_348,"wally_map_add NG[{}]",&local_24);
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_368,"psbt add output unknowns error.",&local_369);
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_368);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        local_24 = 0;
      }
    }
  }
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
  return *pvVar3;
}

Assistant:

static uint8_t SetPsbtOutput(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &value,
    struct wally_psbt_output *output) {
  int ret;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output redeemScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output redeemScript duplicates error.");
    }
    ret = wally_psbt_output_set_redeem_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output redeemScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output witnessScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output witnessScript duplicates error.");
    }
    ret = wally_psbt_output_set_witness_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output witnessScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey");

    if (value.size() < 4) {
      warn(CFD_LOG_SOURCE, "psbt invalid value format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid value format error.");
    }
    size_t path_len = value.size() - 4;
    std::vector<uint32_t> path(path_len / 4);
    if (path_len != 0) {
      // TODO(k-matsuzawa) need endian support.
      memcpy(path.data(), &value.data()[4], path_len);
    }
    ret = wally_map_add_keypath_item(
        &output->keypaths, pk_bytes.data(), pk_bytes.size(), value.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output pubkey error.");
    }
  } else {
    FindPsbtMap(&output->unknowns, key, "output unknowns");
    ret = wally_map_add(
        &output->unknowns, key.data(), key.size(), value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add output unknowns error.");
    }
  }
  return key[0];
}